

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

size_t chunk_append(buf_chunk *chunk,uchar *buf,size_t len)

{
  size_t local_38;
  ulong local_30;
  size_t n;
  uchar *p;
  size_t len_local;
  uchar *buf_local;
  buf_chunk *chunk_local;
  
  local_30 = chunk->dlen - chunk->w_offset;
  if (local_30 != 0) {
    local_38 = len;
    if (local_30 < len) {
      local_38 = local_30;
    }
    local_30 = local_38;
    memcpy((void *)((long)&chunk->x + chunk->w_offset),buf,local_38);
    chunk->w_offset = local_38 + chunk->w_offset;
  }
  return local_30;
}

Assistant:

static size_t chunk_append(struct buf_chunk *chunk,
                           const unsigned char *buf, size_t len)
{
  unsigned char *p = &chunk->x.data[chunk->w_offset];
  size_t n = chunk->dlen - chunk->w_offset;
  DEBUGASSERT(chunk->dlen >= chunk->w_offset);
  if(n) {
    n = CURLMIN(n, len);
    memcpy(p, buf, n);
    chunk->w_offset += n;
  }
  return n;
}